

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_root.cpp
# Opt level: O1

error_code __thiscall pstore::exchange::import_ns::root::begin_object(root *this)

{
  iterator *piVar1;
  context *pcVar2;
  _Elt_pointer puVar3;
  undefined1 auVar4 [16];
  rule *prVar5;
  ulong uVar6;
  pointer __p;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_30;
  _Head_base<0UL,_(anonymous_namespace)::root_object_*,_false> local_28;
  
  pcVar2 = (this->super_rule).context_.ptr_;
  prVar5 = (rule *)operator_new(0x130);
  (prVar5->context_).ptr_ = pcVar2;
  prVar5->_vptr_rule = (_func_int **)&PTR__root_object_002441f8;
  prVar5[1]._vptr_rule = (_func_int **)0x0;
  prVar5[1].context_.ptr_ = (context *)0x0;
  prVar5[2]._vptr_rule = (_func_int **)0x0;
  prVar5[3]._vptr_rule = (_func_int **)&prVar5[2].context_;
  prVar5[2].context_.ptr_ = (context *)&prVar5[2].context_;
  prVar5[3].context_.ptr_ = (context *)0x0;
  prVar5[4].context_.ptr_ = (context *)(prVar5 + 4);
  prVar5[4]._vptr_rule = (_func_int **)(prVar5 + 4);
  prVar5[5]._vptr_rule = (_func_int **)0x0;
  prVar5[5].context_.ptr_ = (context *)&prVar5[8].context_;
  prVar5[6]._vptr_rule = (_func_int **)0x1;
  prVar5[6].context_.ptr_ = (context *)0x0;
  prVar5[7]._vptr_rule = (_func_int **)0x0;
  *(undefined4 *)&prVar5[7].context_.ptr_ = 0x3f800000;
  prVar5[8]._vptr_rule = (_func_int **)0x0;
  prVar5[8].context_.ptr_ = (context *)0x0;
  prVar5[9]._vptr_rule = (_func_int **)0x0;
  prVar5[9].context_.ptr_ = (context *)0x0;
  prVar5[10]._vptr_rule = (_func_int **)0x0;
  prVar5[0xb]._vptr_rule = (_func_int **)&prVar5[10].context_;
  prVar5[10].context_.ptr_ = (context *)&prVar5[10].context_;
  prVar5[0xb].context_.ptr_ = (context *)0x0;
  prVar5[0xc].context_.ptr_ = (context *)(prVar5 + 0xc);
  prVar5[0xc]._vptr_rule = (_func_int **)(prVar5 + 0xc);
  prVar5[0xd]._vptr_rule = (_func_int **)0x0;
  prVar5[0xd].context_.ptr_ = (context *)&prVar5[0x10].context_;
  prVar5[0xe]._vptr_rule = (_func_int **)0x1;
  prVar5[0xe].context_.ptr_ = (context *)0x0;
  prVar5[0xf]._vptr_rule = (_func_int **)0x0;
  *(undefined4 *)&prVar5[0xf].context_.ptr_ = 0x3f800000;
  prVar5[0x10]._vptr_rule = (_func_int **)0x0;
  prVar5[0x10].context_.ptr_ = (context *)0x0;
  prVar5[0x11]._vptr_rule = (_func_int **)0x0;
  prVar5[0x11].context_.ptr_ = (context *)0x0;
  uuid::uuid((uuid *)(prVar5 + 0x12));
  local_28._M_head_impl = (root_object *)0x0;
  puVar3 = (pcVar2->stack).c.
           super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar3 == (pcVar2->stack).c.
                super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    local_30._M_head_impl = prVar5;
    std::
    deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
    ::
    _M_push_back_aux<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
              ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
                *)&pcVar2->stack,
               (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
                *)&local_30);
  }
  else {
    (puVar3->_M_t).
    super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
    .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl = prVar5;
    local_30._M_head_impl = (rule *)0x0;
    piVar1 = &(pcVar2->stack).c.
              super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  if (local_30._M_head_impl != (rule *)0x0) {
    (*(local_30._M_head_impl)->_vptr_rule[1])();
  }
  local_30._M_head_impl = (rule *)0x0;
  std::
  unique_ptr<(anonymous_namespace)::root_object,_std::default_delete<(anonymous_namespace)::root_object>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::root_object,_std::default_delete<(anonymous_namespace)::root_object>_>
                 *)&local_28);
  rule::log_top(&this->super_rule,true);
  uVar6 = std::_V2::system_category();
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar6;
  return (error_code)(auVar4 << 0x40);
}

Assistant:

std::error_code root::begin_object () { return this->push<root_object> (); }